

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.cpp
# Opt level: O0

void __thiscall
dg::vr::VRCodeGraph::VRCodeGraphIterator::VRCodeGraphIterator
          (VRCodeGraphIterator *this,MappingIterator end)

{
  undefined8 in_RSI;
  DFSIt<dg::vr::VRCodeGraph::LazyVisit> *in_RDI;
  
  *(undefined8 *)&(in_RDI->super_LazyVisit).visited._M_t._M_impl = in_RSI;
  *(undefined8 *)&(in_RDI->super_LazyVisit).visited._M_t._M_impl.super__Rb_tree_header._M_header =
       in_RSI;
  DFSIt<dg::vr::VRCodeGraph::LazyVisit>::DFSIt(in_RDI);
  return;
}

Assistant:

VRCodeGraph::VRCodeGraphIterator::VRCodeGraphIterator(MappingIterator end)
        : intoMapping(end), endMapping(end) {}